

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupDestinationRecord.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GroupDestinationRecord::Encode(GroupDestinationRecord *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,this->m_ui32GrpBtField);
  KDataStream::Write(stream,this->m_ui8DstPriority);
  KDataStream::Write(stream,this->m_ui8LnStCmd);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  return;
}

Assistant:

void GroupDestinationRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32GrpBtField
           << m_ui8DstPriority
           << m_ui8LnStCmd
           << m_ui16Padding1;
}